

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O2

code_point_t onmt::unicode::utf8_to_cp(char *str,size_t *length)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  ulong uStack_8;
  
  bVar1 = *str;
  uStack_8 = 1;
  if (-1 < (char)bVar1) {
    uVar4 = (uint)bVar1;
    goto LAB_001fb35d;
  }
  uVar4 = 0xffffffff;
  if (bVar1 < 0xe0) {
    if (bVar1 < 0xc2) goto LAB_001fb35d;
    uVar2 = bVar1 & 0x1f;
    uStack_8 = 1;
  }
  else {
    if (bVar1 < 0xf0) {
      uVar2 = bVar1 & 0xf;
      if (((byte)" 000000000000\x1000"[uVar2] >> ((byte)str[1] >> 5) & 1) == 0) goto LAB_001fb35d;
      bVar3 = str[1] & 0x3f;
      uStack_8 = 2;
    }
    else {
      if (0xf4 < bVar1) goto LAB_001fb35d;
      if (((uint)(int)""[(byte)str[1] >> 4] >> (bVar1 - 0xf0 & 0x1f) & 1) == 0) goto LAB_001fb35d;
      bVar3 = str[2] + 0x80;
      if (0x3f < bVar3) {
        uStack_8 = 2;
        goto LAB_001fb35d;
      }
      uVar2 = (byte)str[1] & 0x3f | (bVar1 - 0xf0) * 0x40;
      uStack_8 = 3;
    }
    uVar2 = (uint)bVar3 | uVar2 << 6;
  }
  if ((byte)((byte)str[uStack_8] ^ 0x80) < 0x40) {
    uVar4 = uVar2 << 6 | (byte)str[uStack_8] ^ 0x80;
    uStack_8 = (ulong)((int)uStack_8 + 1);
  }
LAB_001fb35d:
  if (length != (size_t *)0x0) {
    if ((int)uVar4 < 0) {
      uStack_8 = 0;
    }
    *length = uStack_8;
  }
  uVar2 = 0;
  if (0 < (int)uVar4) {
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

code_point_t utf8_to_cp(const char* str, size_t* length)
    {
      UChar32 c = -1;
      int32_t offset = 0;
      U8_NEXT(str, offset, -1, c);
      if (c < 0)
      {
        c = 0;
        offset = 0;
      }
      if (length)
        *length = offset;
      return c;
    }